

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::PushStyleColor(ImPlotCol idx,ImU32 col)

{
  undefined8 *puVar1;
  ImVec4 IVar2;
  undefined1 local_2c [8];
  ImGuiColorMod backup;
  ImPlotContext *gp;
  ImU32 col_local;
  ImPlotCol idx_local;
  
  backup.BackupValue._8_8_ = GImPlot;
  ImGuiColorMod::ImGuiColorMod((ImGuiColorMod *)local_2c);
  puVar1 = (undefined8 *)(backup.BackupValue._8_8_ + 0x308 + (long)idx * 0x10);
  unique0x10000077 = *puVar1;
  backup.BackupValue._0_8_ = puVar1[1];
  local_2c._0_4_ = idx;
  ImVector<ImGuiColorMod>::push_back
            ((ImVector<ImGuiColorMod> *)(backup.BackupValue._8_8_ + 0x490),(ImGuiColorMod *)local_2c
            );
  IVar2 = ImGui::ColorConvertU32ToFloat4(col);
  puVar1 = (undefined8 *)(backup.BackupValue._8_8_ + 0x308 + (long)idx * 0x10);
  *puVar1 = IVar2._0_8_;
  puVar1[1] = IVar2._8_8_;
  return;
}

Assistant:

void PushStyleColor(ImPlotCol idx, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = gp.Style.Colors[idx];
    gp.ColorModifiers.push_back(backup);
    gp.Style.Colors[idx] = ImGui::ColorConvertU32ToFloat4(col);
}